

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint8 *puVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  size_t __n;
  void *__src;
  uint uVar6;
  ptrdiff_t size;
  uint8 *ptr_local;
  string *s_local;
  uint32 num_local;
  EpsCopyOutputStream *this_local;
  byte *local_20;
  uint local_14;
  byte *local_10;
  
  __n = std::__cxx11::string::size();
  bVar2 = true;
  if ((long)__n < 0x80) {
    puVar1 = this->end_;
    iVar5 = TagSize(num << 3);
    bVar2 = (long)(puVar1 + (-(long)iVar5 - (long)ptr) + 0xf) < (long)__n;
  }
  if (bVar2) {
    this_local = (EpsCopyOutputStream *)WriteStringMaybeAliasedOutline(this,num,s,ptr);
  }
  else {
    uVar6 = num << 3 | 2;
    bVar4 = (byte)uVar6;
    if (uVar6 < 0x80) {
      *ptr = bVar4;
      local_10 = ptr + 1;
    }
    else {
      *ptr = bVar4 | 0x80;
      local_14 = (num << 3) >> 7;
      if (local_14 < 0x80) {
        ptr[1] = (uint8)local_14;
        local_10 = ptr + 2;
      }
      else {
        pbVar3 = ptr + 1;
        do {
          local_20 = pbVar3;
          *local_20 = (byte)local_14 | 0x80;
          local_14 = local_14 >> 7;
          pbVar3 = local_20 + 1;
        } while (0x7f < local_14);
        local_10 = local_20 + 2;
        local_20[1] = (byte)local_14;
      }
    }
    *local_10 = (byte)__n;
    __src = (void *)std::__cxx11::string::data();
    memcpy(local_10 + 1,__src,__n);
    this_local = (EpsCopyOutputStream *)(local_10 + 1 + __n);
  }
  return (uint8 *)this_local;
}

Assistant:

uint8* WriteStringMaybeAliased(uint32 num, const std::string& s, uint8* ptr) {
    std::ptrdiff_t size = s.size();
    if (PROTOBUF_PREDICT_FALSE(
            size >= 128 || end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }